

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserStates.h
# Opt level: O0

unique_ptr<gurkenlaeufer::IParserState,_std::default_delete<gurkenlaeufer::IParserState>_>
__thiscall
gurkenlaeufer::CommonParserState::forwardToNextState
          (CommonParserState *this,string *trimmedLine,
          list<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_> *backgroundSteps)

{
  long *plVar1;
  bool bVar2;
  pointer pIVar3;
  list<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_> *in_RCX;
  unique_ptr<gurkenlaeufer::IParserState,_std::default_delete<gurkenlaeufer::IParserState>_>
  local_60;
  unique_ptr<gurkenlaeufer::IParserState,_std::default_delete<gurkenlaeufer::IParserState>_>
  nextState;
  list<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_> local_48;
  unique_ptr<gurkenlaeufer::IParserState,_std::default_delete<gurkenlaeufer::IParserState>_>
  local_30;
  IParserStatePtr initState;
  list<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_> *backgroundSteps_local;
  string *trimmedLine_local;
  CommonParserState *this_local;
  
  plVar1 = (long *)trimmedLine->_M_string_length;
  std::__cxx11::list<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_>::list
            (&local_48,in_RCX);
  (**(code **)(*plVar1 + 0x10))(&local_30,plVar1,&local_48);
  std::__cxx11::list<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_>::~list(&local_48);
  pIVar3 = std::
           unique_ptr<gurkenlaeufer::IParserState,_std::default_delete<gurkenlaeufer::IParserState>_>
           ::operator->(&local_30);
  (*pIVar3->_vptr_IParserState[2])(&local_60,pIVar3,backgroundSteps);
  bVar2 = std::operator!=(&local_60,(nullptr_t)0x0);
  if (bVar2) {
    std::unique_ptr<gurkenlaeufer::IParserState,_std::default_delete<gurkenlaeufer::IParserState>_>
    ::unique_ptr((unique_ptr<gurkenlaeufer::IParserState,_std::default_delete<gurkenlaeufer::IParserState>_>
                  *)this,&local_60);
  }
  else {
    std::unique_ptr<gurkenlaeufer::IParserState,_std::default_delete<gurkenlaeufer::IParserState>_>
    ::unique_ptr((unique_ptr<gurkenlaeufer::IParserState,_std::default_delete<gurkenlaeufer::IParserState>_>
                  *)this,&local_30);
  }
  std::unique_ptr<gurkenlaeufer::IParserState,_std::default_delete<gurkenlaeufer::IParserState>_>::
  ~unique_ptr(&local_60);
  std::unique_ptr<gurkenlaeufer::IParserState,_std::default_delete<gurkenlaeufer::IParserState>_>::
  ~unique_ptr(&local_30);
  return (__uniq_ptr_data<gurkenlaeufer::IParserState,_std::default_delete<gurkenlaeufer::IParserState>,_true,_true>
          )(__uniq_ptr_data<gurkenlaeufer::IParserState,_std::default_delete<gurkenlaeufer::IParserState>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<IParserState> forwardToNextState(const std::string& trimmedLine, std::list<Step> backgroundSteps) const
    {
        auto initState = _factory.createInitialState(std::move(backgroundSteps));
        auto nextState = initState->parseLine(trimmedLine);
        if (nextState != nullptr) {
            return nextState;
        }
        return initState;
    }